

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

double matd_max(matd_t *m)

{
  matd_t mVar1;
  int x;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  matd_t mVar6;
  
  mVar6.nrows = 0xffffffff;
  mVar6.ncols = 0xffefffff;
  for (uVar2 = 0; uVar2 != m->nrows; uVar2 = uVar2 + 1) {
    uVar3 = (ulong)m->ncols;
    uVar4 = m->ncols * uVar2;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      mVar1 = m[(ulong)uVar4 + 1];
      if ((double)m[(ulong)uVar4 + 1] <= (double)mVar6) {
        mVar1 = mVar6;
      }
      mVar6 = mVar1;
      uVar4 = uVar4 + 1;
    }
  }
  return (double)mVar6;
}

Assistant:

double matd_max(matd_t *m)
{
    double d = -DBL_MAX;
    for(int x=0; x<m->nrows; x++) {
        for(int y=0; y<m->ncols; y++) {
            if(MATD_EL(m, x, y) > d)
                d = MATD_EL(m, x, y);
        }
    }

    return d;
}